

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManIsoStrashReduce2(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  Vec_Int_t *in_RAX;
  Vec_Wec_t *vSupps;
  Gia_Man_t *pGVar1;
  Vec_Int_t *vCoMap;
  Vec_Int_t *local_28;
  
  local_28 = in_RAX;
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  pGVar1 = Gia_ManDupStrashReduce(p,vSupps,&local_28);
  Vec_IntFree(local_28);
  Vec_WecFree(vSupps);
  *pvPosEquivs = (Vec_Ptr_t *)0x0;
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce2( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Int_t * vCoMap;
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Gia_Man_t * pNew = Gia_ManDupStrashReduce( p, vSupps, &vCoMap );
    Vec_IntFree( vCoMap );
    Vec_WecFree( vSupps );
    *pvPosEquivs = NULL;
    return pNew;
}